

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O0

int blake2sp_init_root(blake2s_state *S,size_t outlen,size_t keylen)

{
  int iVar1;
  undefined1 local_48 [8];
  blake2s_param P [1];
  size_t keylen_local;
  size_t outlen_local;
  blake2s_state *S_local;
  
  local_48[0] = (uint8_t)outlen;
  local_48[1] = (uint8_t)keylen;
  local_48[2] = '\b';
  local_48[3] = '\x02';
  store32(local_48 + 4,0);
  store32(P,0);
  store16(&P[0].leaf_length,0);
  P[0].leaf_length._2_1_ = 1;
  P[0].leaf_length._3_1_ = 0x20;
  memset(&P[0].node_offset,0,8);
  memset(P[0].salt,0,8);
  iVar1 = blake2s_init_param(S,(blake2s_param *)local_48);
  return iVar1;
}

Assistant:

static int blake2sp_init_root( blake2s_state *S, size_t outlen, size_t keylen )
{
  blake2s_param P[1];
  P->digest_length = (uint8_t)outlen;
  P->key_length = (uint8_t)keylen;
  P->fanout = PARALLELISM_DEGREE;
  P->depth = 2;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, 0 );
  store16( &P->xof_length, 0 );
  P->node_depth = 1;
  P->inner_length = BLAKE2S_OUTBYTES;
  memset( P->salt, 0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2s_init_param( S, P );
}